

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::lerp
          (LightNodeImpl<embree::SceneGraph::DistantLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long *plVar17;
  _func_int **pp_Var18;
  long *in_RDX;
  float __x;
  float fVar19;
  float fVar20;
  float fVar21;
  
  if (*in_RDX == 0) {
    plVar17 = (long *)0x0;
  }
  else {
    plVar17 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
  }
  if (plVar17 != (long *)0x0) {
    (**(code **)(*plVar17 + 0x10))(plVar17);
  }
  pp_Var18 = (_func_int **)alignedMalloc(0xb0,0x10);
  fVar20 = 1.0 - f;
  fVar1 = *(float *)(plVar17 + 0x10);
  fVar2 = *(float *)((long)plVar17 + 0x84);
  fVar3 = *(float *)(plVar17 + 0x11);
  fVar4 = *(float *)((long)plVar17 + 0x8c);
  fVar5 = *(float *)&light1_in[0x10].ptr;
  fVar6 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar7 = *(float *)&light1_in[0x11].ptr;
  fVar8 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar9 = *(float *)(plVar17 + 0x12);
  fVar10 = *(float *)((long)plVar17 + 0x94);
  fVar11 = *(float *)(plVar17 + 0x13);
  fVar12 = *(float *)((long)plVar17 + 0x9c);
  fVar13 = *(float *)&light1_in[0x12].ptr;
  fVar14 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar15 = *(float *)&light1_in[0x13].ptr;
  fVar16 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar21 = fVar20 * *(float *)&light1_in[0x14].ptr + f * *(float *)(plVar17 + 0x14);
  __x = fVar21 * 0.017453292;
  fVar19 = cosf(__x);
  pp_Var18[1] = (_func_int *)0x0;
  pp_Var18[2] = (_func_int *)(pp_Var18 + 4);
  pp_Var18[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var18 + 4) = 0;
  pp_Var18[6] = (_func_int *)(pp_Var18 + 8);
  pp_Var18[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var18 + 8) = 0;
  pp_Var18[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var18 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var18 + 0x5c) = 0xffffffff;
  pp_Var18[0xc] = (_func_int *)0x0;
  *pp_Var18 = (_func_int *)&PTR__Node_002e59e0;
  *(undefined4 *)(pp_Var18 + 0xe) = 4;
  pp_Var18[0x10] = (_func_int *)CONCAT44(fVar6 * fVar20 + fVar2 * f,fVar5 * fVar20 + fVar1 * f);
  pp_Var18[0x11] = (_func_int *)CONCAT44(fVar8 * fVar20 + fVar4 * f,fVar7 * fVar20 + fVar3 * f);
  pp_Var18[0x12] = (_func_int *)CONCAT44(fVar20 * fVar14 + f * fVar10,fVar20 * fVar13 + f * fVar9);
  pp_Var18[0x13] = (_func_int *)CONCAT44(fVar20 * fVar16 + f * fVar12,fVar20 * fVar15 + f * fVar11);
  *(float *)(pp_Var18 + 0x14) = fVar21;
  *(float *)((long)pp_Var18 + 0xa4) = __x;
  *(float *)(pp_Var18 + 0x15) = fVar19;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var18;
  LOCK();
  pp_Var18[1] = pp_Var18[1] + 1;
  UNLOCK();
  if (plVar17 != (long *)0x0) {
    (**(code **)(*plVar17 + 0x18))(plVar17);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }